

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O1

int ngram_search_find_exit(ngram_search_t *ngs,int frame_idx,int32 *out_best_score)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int32 *piVar8;
  bool bVar9;
  
  iVar1 = ngs->n_frame;
  iVar3 = -1;
  if (iVar1 != 0) {
    uVar7 = (ulong)(iVar1 - 1U);
    if (frame_idx < iVar1) {
      uVar7 = (ulong)(uint)frame_idx;
    }
    if (frame_idx == -1) {
      uVar7 = (ulong)(iVar1 - 1U);
    }
    piVar8 = ngs->bp_table_idx;
    uVar5 = (uint)uVar7;
    iVar1 = piVar8[(int)uVar5];
    if (-1 < (int)uVar5) {
      do {
        uVar5 = (uint)uVar7;
        if (piVar8[uVar7] != iVar1) goto LAB_0013646c;
        uVar7 = (ulong)(uVar5 - 1);
      } while (0 < (int)uVar5);
      uVar5 = 0xffffffff;
    }
LAB_0013646c:
    if (-1 < (int)uVar5) {
      if (ngs->bp_table_size <= iVar1) {
        __assert_fail("end_bpidx < ngs->bp_table_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x20f,"int ngram_search_find_exit(ngram_search_t *, int, int32 *)");
      }
      iVar6 = piVar8[uVar5];
      if (iVar6 < iVar1) {
        iVar2 = (ngs->base).finish_wid;
        piVar8 = &ngs->bp_table[iVar6].score;
        iVar3 = -1;
        iVar4 = -0x20000000;
        do {
          if ((piVar8[-2] == iVar2) || (iVar4 < *piVar8)) {
            iVar4 = *piVar8;
            iVar3 = iVar6;
          }
          if (piVar8[-2] == iVar2) break;
          piVar8 = piVar8 + 9;
          bVar9 = iVar1 + -1 != iVar6;
          iVar6 = iVar6 + 1;
        } while (bVar9);
      }
      else {
        iVar4 = -0x20000000;
        iVar3 = -1;
      }
      if (out_best_score != (int32 *)0x0) {
        *out_best_score = iVar4;
      }
    }
  }
  return iVar3;
}

Assistant:

int
ngram_search_find_exit(ngram_search_t *ngs, int frame_idx, int32 *out_best_score)
{
    /* End of backpointers for this frame. */
    int end_bpidx;
    int best_exit, bp;
    int32 best_score;

    /* No hypothesis means no exit node! */
    if (ngs->n_frame == 0)
        return NO_BP;

    if (frame_idx == -1 || frame_idx >= ngs->n_frame)
        frame_idx = ngs->n_frame - 1;
    end_bpidx = ngs->bp_table_idx[frame_idx];

    best_score = WORST_SCORE;
    best_exit = NO_BP;

    /* Scan back to find a frame with some backpointers in it. */
    while (frame_idx >= 0 && ngs->bp_table_idx[frame_idx] == end_bpidx)
        --frame_idx;
    /* This is NOT an error, it just means there is no hypothesis yet. */
    if (frame_idx < 0)
        return NO_BP;

    /* Now find the entry for </s> OR the best scoring entry. */
    assert(end_bpidx < ngs->bp_table_size);
    for (bp = ngs->bp_table_idx[frame_idx]; bp < end_bpidx; ++bp) {
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs)
            || ngs->bp_table[bp].score BETTER_THAN best_score) {
            best_score = ngs->bp_table[bp].score;
            best_exit = bp;
        }
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs))
            break;
    }

    if (out_best_score) {
	*out_best_score = best_score;
    }
    return best_exit;
}